

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ParseBoolFlag(char *str,char *flag,bool *value)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = ParseFlagValue(str,flag,true);
  if (pcVar3 != (char *)0x0) {
    cVar1 = *pcVar3;
    bVar4 = false;
    if ((cVar1 != '0') && (bVar4 = false, cVar1 != 'f')) {
      bVar4 = cVar1 != 'F';
    }
    *value = bVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pcVar3 != (char *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static bool ParseBoolFlag(const char* str, const char* flag, bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}